

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numpy.h
# Opt level: O0

void __thiscall pybind11::array::resize(array *this,ShapeContainer *new_shape,bool refcheck)

{
  bool bVar1;
  vector<long,_std::allocator<long>_> *pvVar2;
  npy_api *pnVar3;
  PyObject *ptr;
  error_already_set *this_00;
  array local_60;
  PyObject *local_58;
  handle local_40;
  handle local_38;
  object new_array;
  PyArray_Dims d;
  bool refcheck_local;
  ShapeContainer *new_shape_local;
  array *this_local;
  
  pvVar2 = detail::any_container<long>::operator->(new_shape);
  new_array.super_handle.m_ptr = (handle)std::vector<long,_std::allocator<long>_>::data(pvVar2);
  pvVar2 = detail::any_container<long>::operator->(new_shape);
  std::vector<long,_std::allocator<long>_>::size(pvVar2);
  pnVar3 = detail::npy_api::get();
  ptr = (*pnVar3->PyArray_Resize_)
                  ((this->super_buffer).super_object.super_handle.m_ptr,(PyArray_Dims *)&new_array,
                   SUB14(refcheck,0),-1);
  handle::handle(&local_40,ptr);
  reinterpret_steal<pybind11::object>((pybind11 *)&local_38,local_40);
  bVar1 = handle::operator_cast_to_bool(&local_38);
  if (bVar1) {
    local_58 = local_38.m_ptr;
    bVar1 = isinstance<pybind11::array,_0>(local_38);
    if (bVar1) {
      array(&local_60,(object *)&local_38);
      operator=(this,&local_60);
      ~array(&local_60);
    }
    object::~object((object *)&local_38);
    return;
  }
  this_00 = (error_already_set *)__cxa_allocate_exception(0x28);
  error_already_set::error_already_set(this_00);
  __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
}

Assistant:

void resize(ShapeContainer new_shape, bool refcheck = true) {
        detail::npy_api::PyArray_Dims d = {
            new_shape->data(), int(new_shape->size())
        };
        // try to resize, set ordering param to -1 cause it's not used anyway
        object new_array = reinterpret_steal<object>(
            detail::npy_api::get().PyArray_Resize_(m_ptr, &d, int(refcheck), -1)
        );
        if (!new_array) throw error_already_set();
        if (isinstance<array>(new_array)) { *this = std::move(new_array); }
    }